

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

ChromeCompositorSchedulerState * __thiscall
perfetto::protos::gen::ChromeCompositorSchedulerState::operator=
          (ChromeCompositorSchedulerState *this,ChromeCompositorSchedulerState *param_1)

{
  ChromeCompositorSchedulerState *param_1_local;
  ChromeCompositorSchedulerState *this_local;
  
  protozero::CppMessageObj::operator=(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  protozero::CopyablePtr<perfetto::protos::gen::ChromeCompositorStateMachine>::operator=
            (&this->state_machine_,&param_1->state_machine_);
  memcpy(&this->observing_begin_frame_source_,&param_1->observing_begin_frame_source_,0x38);
  protozero::CopyablePtr<perfetto::protos::gen::BeginImplFrameArgs>::operator=
            (&this->begin_impl_frame_args_,&param_1->begin_impl_frame_args_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameObserverState>::operator=
            (&this->begin_frame_observer_state_,&param_1->begin_frame_observer_state_);
  protozero::CopyablePtr<perfetto::protos::gen::BeginFrameSourceState>::operator=
            (&this->begin_frame_source_state_,&param_1->begin_frame_source_state_);
  protozero::CopyablePtr<perfetto::protos::gen::CompositorTimingHistory>::operator=
            (&this->compositor_timing_history_,&param_1->compositor_timing_history_);
  ::std::__cxx11::string::operator=
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

bool ChromeCompositorSchedulerState::operator==(const ChromeCompositorSchedulerState& other) const {
  return unknown_fields_ == other.unknown_fields_
   && state_machine_ == other.state_machine_
   && observing_begin_frame_source_ == other.observing_begin_frame_source_
   && begin_impl_frame_deadline_task_ == other.begin_impl_frame_deadline_task_
   && pending_begin_frame_task_ == other.pending_begin_frame_task_
   && skipped_last_frame_missed_exceeded_deadline_ == other.skipped_last_frame_missed_exceeded_deadline_
   && inside_action_ == other.inside_action_
   && deadline_mode_ == other.deadline_mode_
   && deadline_us_ == other.deadline_us_
   && deadline_scheduled_at_us_ == other.deadline_scheduled_at_us_
   && now_us_ == other.now_us_
   && now_to_deadline_delta_us_ == other.now_to_deadline_delta_us_
   && now_to_deadline_scheduled_at_delta_us_ == other.now_to_deadline_scheduled_at_delta_us_
   && begin_impl_frame_args_ == other.begin_impl_frame_args_
   && begin_frame_observer_state_ == other.begin_frame_observer_state_
   && begin_frame_source_state_ == other.begin_frame_source_state_
   && compositor_timing_history_ == other.compositor_timing_history_;
}